

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_collector.cpp
# Opt level: O1

SinkFinalizeType __thiscall
duckdb::PhysicalArrowCollector::Finalize
          (PhysicalArrowCollector *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  GlobalSinkState *pGVar1;
  _func_int **pp_Var2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  _func_int **pp_Var6;
  pointer this_00;
  ArrowQueryResult *pAVar7;
  InternalException *this_01;
  _func_int **local_80;
  ClientProperties local_78;
  vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
  local_48;
  
  pGVar1 = input->global_state;
  if (*(long *)&pGVar1[1].super_StateWithBlockableTasks ==
      pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align) {
    if (pGVar1[2]._vptr_GlobalSinkState != (_func_int **)0x0) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_78.time_zone._M_dataplus._M_p = (pointer)&local_78.time_zone.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,
                 "PhysicalArrowCollector Finalize contains no chunks, but tuple_count is non-zero (%d)"
                 ,"");
      InternalException::InternalException<unsigned_long>
                (this_01,&local_78.time_zone,(unsigned_long)pGVar1[2]._vptr_GlobalSinkState);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ClientContext::GetClientProperties(&local_78,context);
    make_uniq<duckdb::ArrowQueryResult,duckdb::StatementType_const&,duckdb::StatementProperties_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::ClientProperties,unsigned_long_const&>
              ((duckdb *)&local_80,&(this->super_PhysicalResultCollector).statement_type,
               &(this->super_PhysicalResultCollector).properties,
               &(this->super_PhysicalResultCollector).names,
               &(this->super_PhysicalResultCollector).super_PhysicalOperator.types,&local_78,
               &this->record_batch_size);
    pp_Var6 = local_80;
    local_80 = (_func_int **)0x0;
    pp_Var2 = pGVar1[1]._vptr_GlobalSinkState;
    pGVar1[1]._vptr_GlobalSinkState = pp_Var6;
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 8))();
    }
    if (local_80 != (_func_int **)0x0) {
      (**(code **)((long)*local_80 + 8))();
    }
    local_80 = (_func_int **)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.time_zone._M_dataplus._M_p != &local_78.time_zone.field_2) {
      operator_delete(local_78.time_zone._M_dataplus._M_p);
    }
  }
  else {
    ClientContext::GetClientProperties(&local_78,context);
    make_uniq<duckdb::ArrowQueryResult,duckdb::StatementType_const&,duckdb::StatementProperties_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::ClientProperties,unsigned_long_const&>
              ((duckdb *)&local_80,&(this->super_PhysicalResultCollector).statement_type,
               &(this->super_PhysicalResultCollector).properties,
               &(this->super_PhysicalResultCollector).names,
               &(this->super_PhysicalResultCollector).super_PhysicalOperator.types,&local_78,
               &this->record_batch_size);
    pp_Var6 = local_80;
    local_80 = (_func_int **)0x0;
    pp_Var2 = pGVar1[1]._vptr_GlobalSinkState;
    pGVar1[1]._vptr_GlobalSinkState = pp_Var6;
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 8))();
    }
    if (local_80 != (_func_int **)0x0) {
      (**(code **)((long)*local_80 + 8))();
    }
    local_80 = (_func_int **)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.time_zone._M_dataplus._M_p != &local_78.time_zone.field_2) {
      operator_delete(local_78.time_zone._M_dataplus._M_p);
    }
    this_00 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
              operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                          *)(pGVar1 + 1));
    pAVar7 = QueryResult::Cast<duckdb::ArrowQueryResult>(this_00);
    puVar3 = *(pointer *)&pGVar1[1].super_StateWithBlockableTasks;
    puVar4 = (pointer)pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                      __align;
    puVar5 = *(pointer *)
              ((long)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8);
    *(undefined8 *)
     ((long)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8) = 0;
    *(undefined8 *)&pGVar1[1].super_StateWithBlockableTasks = 0;
    pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align = 0;
    local_78.time_zone._M_dataplus._M_p =
         (pointer)(pAVar7->arrays).
                  super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_78.time_zone._M_string_length =
         (size_type)
         (pAVar7->arrays).
         super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_78.time_zone.field_2._M_allocated_capacity =
         (size_type)
         (pAVar7->arrays).
         super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pAVar7->arrays).
    super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar3;
    (pAVar7->arrays).
    super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar4;
    (pAVar7->arrays).
    super_vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar5;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
               *)&local_78);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>_>_>
    ::~vector(&local_48);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalArrowCollector::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                  OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<ArrowCollectorGlobalState>();

	if (gstate.chunks.empty()) {
		if (gstate.tuple_count != 0) {
			throw InternalException(
			    "PhysicalArrowCollector Finalize contains no chunks, but tuple_count is non-zero (%d)",
			    gstate.tuple_count);
		}
		gstate.result = make_uniq<ArrowQueryResult>(statement_type, properties, names, types,
		                                            context.GetClientProperties(), record_batch_size);
		return SinkFinalizeType::READY;
	}

	gstate.result = make_uniq<ArrowQueryResult>(statement_type, properties, names, types, context.GetClientProperties(),
	                                            record_batch_size);
	auto &arrow_result = gstate.result->Cast<ArrowQueryResult>();
	arrow_result.SetArrowData(std::move(gstate.chunks));

	return SinkFinalizeType::READY;
}